

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O2

void __thiscall
adios2::query::QueryVar::LoadSelection(QueryVar *this,string *startStr,string *countStr)

{
  bool bVar1;
  allocator local_e3;
  allocator local_e2;
  allocator local_e1;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  Dims count;
  Dims start;
  Dims shape;
  
  split(&start,startStr,',');
  split(&count,countStr,',');
  if ((long)start.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)start.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start !=
      (long)count.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)count.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start) {
    std::__cxx11::string::string((string *)&local_80,"Toolkit",(allocator *)&shape);
    std::__cxx11::string::string((string *)&local_a0,"query::QueryVar",&local_e1);
    std::__cxx11::string::string((string *)&local_c0,"LoadSelection",&local_e2);
    std::__cxx11::string::string
              ((string *)&local_e0,"dim of startcount does match in the bounding box definition",
               &local_e3);
    helper::Throw<std::ios_base::failure[abi:cxx11]>(&local_80,&local_a0,&local_c0,&local_e0,-1);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_80);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&shape,&(this->m_Selection).second);
  SetSelection(this,&start,&count);
  bVar1 = IsSelectionValid(this,&shape);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_80,"Toolkit",&local_e1);
    std::__cxx11::string::string((string *)&local_a0,"query::QueryVar",&local_e2);
    std::__cxx11::string::string((string *)&local_c0,"LoadSelection",&local_e3);
    std::operator+(&local_e0,"invalid selections for selection of var: ",&this->m_VarName);
    helper::Throw<std::ios_base::failure[abi:cxx11]>(&local_80,&local_a0,&local_c0,&local_e0,-1);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_80);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&count.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&start.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

void QueryVar::LoadSelection(const std::string &startStr, const std::string &countStr)
{
    adios2::Dims start = split(startStr, ',');
    adios2::Dims count = split(countStr, ',');

    if (start.size() != count.size())
    {
        helper::Throw<std::ios_base::failure>(
            "Toolkit", "query::QueryVar", "LoadSelection",
            "dim of startcount does match in the bounding box definition");
    }

    // simpleQ.setSelection(box.first, box.second);
    adios2::Dims shape = this->m_Selection.second; // set at the creation for default
    this->SetSelection(start, count);
    if (!this->IsSelectionValid(shape))
        helper::Throw<std::ios_base::failure>("Toolkit", "query::QueryVar", "LoadSelection",
                                              "invalid selections for selection of var: " +
                                                  this->GetVarName());
}